

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endpoint.hpp
# Opt level: O0

void __thiscall
canary::basic_endpoint<canary::raw>::resize(basic_endpoint<canary::raw> *this,size_t n)

{
  error_code ec_00;
  size_t sVar1;
  system_error *this_00;
  undefined1 auStack_28 [8];
  error_code ec;
  size_t n_local;
  basic_endpoint<canary::raw> *this_local;
  
  ec.cat_ = (error_category *)n;
  sVar1 = capacity(this);
  if (sVar1 < n) {
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              ((error_code *)auStack_28,invalid_argument,(type *)0x0);
    this_00 = (system_error *)__cxa_allocate_exception(0x40);
    ec_00.cat_ = (error_category *)ec._0_8_;
    ec_00.val_ = auStack_28._0_4_;
    ec_00.failed_ = (bool)auStack_28[4];
    ec_00._5_3_ = auStack_28._5_3_;
    boost::system::system_error::system_error(this_00,ec_00);
    __cxa_throw(this_00,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  return;
}

Assistant:

void resize(std::size_t n)
    {
        if (n > capacity())
        {
            error_code ec{net::error::invalid_argument};
            throw system_error{ec};
        }
    }